

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O2

int ngram_model_free(ngram_model_t *model)

{
  int iVar1;
  _func_void_ngram_model_t_ptr *p_Var2;
  ngram_class_s *pnVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  if (model != (ngram_model_t *)0x0) {
    iVar1 = model->refcount;
    iVar4 = iVar1 + -1;
    model->refcount = iVar4;
    if (iVar1 < 2) {
      if ((model->funcs != (ngram_funcs_s *)0x0) &&
         (p_Var2 = model->funcs->free, p_Var2 != (_func_void_ngram_model_t_ptr *)0x0)) {
        (*p_Var2)(model);
      }
      if (model->writable == '\0') {
        for (uVar8 = 0; uVar8 < model->n_classes; uVar8 = uVar8 + 1) {
          pnVar3 = model->classes[uVar8];
          for (lVar7 = 0; (int)lVar7 < pnVar3->n_words; lVar7 = lVar7 + 1) {
            ckd_free(model->word_str[pnVar3->start_wid + lVar7]);
          }
          lVar7 = 0;
          for (lVar6 = 0; lVar6 < pnVar3->n_hash; lVar6 = lVar6 + 1) {
            lVar5 = (long)*(int *)((long)&pnVar3->nword_hash->wid + lVar7);
            if (lVar5 != -1) {
              ckd_free(model->word_str[lVar5]);
            }
            lVar7 = lVar7 + 0xc;
          }
        }
      }
      else {
        for (lVar7 = 0; lVar7 < model->n_words; lVar7 = lVar7 + 1) {
          ckd_free(model->word_str[lVar7]);
        }
      }
      for (uVar8 = 0; uVar8 < model->n_classes; uVar8 = uVar8 + 1) {
        ngram_class_free(model->classes[uVar8]);
      }
      ckd_free(model->classes);
      hash_table_free(model->wid);
      ckd_free(model->word_str);
      ckd_free(model->n_counts);
      ckd_free(model);
      iVar4 = 0;
    }
    return iVar4;
  }
  return 0;
}

Assistant:

int
ngram_model_free(ngram_model_t * model)
{
    int i;

    if (model == NULL)
        return 0;
    if (--model->refcount > 0)
        return model->refcount;
    if (model->funcs && model->funcs->free)
        (*model->funcs->free) (model);
    if (model->writable) {
        /* Free all words. */
        for (i = 0; i < model->n_words; ++i) {
            ckd_free(model->word_str[i]);
        }
    }
    else {
        /* Free all class words. */
        for (i = 0; i < model->n_classes; ++i) {
            ngram_class_t *lmclass;
            int32 j;

            lmclass = model->classes[i];
            for (j = 0; j < lmclass->n_words; ++j) {
                ckd_free(model->word_str[lmclass->start_wid + j]);
            }
            for (j = 0; j < lmclass->n_hash; ++j) {
                if (lmclass->nword_hash[j].wid != -1) {
                    ckd_free(model->word_str[lmclass->nword_hash[j].wid]);
                }
            }
        }
    }
    for (i = 0; i < model->n_classes; ++i) {
        ngram_class_free(model->classes[i]);
    }
    ckd_free(model->classes);
    hash_table_free(model->wid);
    ckd_free(model->word_str);
    ckd_free(model->n_counts);
    ckd_free(model);
    return 0;
}